

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SATSolver.hpp
# Opt level: O1

void __thiscall
SAT::PrimitiveProofRecordingSATSolver::PrimitiveProofRecordingSATSolver
          (PrimitiveProofRecordingSATSolver *this)

{
  SATClause *this_00;
  PropInference *val;
  
  (this->super_SATSolverWithAssumptions)._failedAssumptionBuffer._cursor = (SATLiteral *)0x0;
  (this->super_SATSolverWithAssumptions)._failedAssumptionBuffer._end = (SATLiteral *)0x0;
  (this->super_SATSolverWithAssumptions)._failedAssumptionBuffer._capacity = 0;
  (this->super_SATSolverWithAssumptions)._failedAssumptionBuffer._stack = (SATLiteral *)0x0;
  (this->super_SATSolverWithAssumptions).super_SATSolver._vptr_SATSolver =
       (_func_int **)&PTR__SATSolverWithAssumptions_00b6a620;
  this->_addedClauses = (SATClauseList *)0x0;
  this_00 = (SATClause *)SATClause::operator_new(0x18,0);
  SATClause::SATClause(this_00,0);
  this->_refutation = this_00;
  val = (PropInference *)
        ::Lib::FixedSizeAllocator<16UL>::alloc
                  ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  (val->super_SATInference)._vptr_SATInference = (_func_int **)&PTR__PropInference_00b67988;
  val->_premises = (SATClauseList *)0x0;
  this->_refutationInference = val;
  SATClause::setInference(this->_refutation,(SATInference *)val);
  return;
}

Assistant:

PrimitiveProofRecordingSATSolver() :
    _addedClauses(0), _refutation(new(0) SATClause(0)), _refutationInference(new PropInference(SATClauseList::empty()))
    {
      _refutation->setInference(_refutationInference);
    }